

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::shorten_number(string *unit_string,size_t loc,size_t length)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 *puVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  int local_28;
  char local_21;
  int kk;
  value_type c;
  size_t length_local;
  size_t loc_local;
  string *unit_string_local;
  
  _kk = length;
  length_local = loc;
  loc_local = (size_t)unit_string;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
  local_21 = *pcVar3;
  if (local_21 == '.') {
    pcVar3 = (char *)std::__cxx11::string::operator[](loc_local);
    local_21 = *pcVar3;
  }
  std::__cxx11::string::erase(loc_local,length_local);
  if (local_21 == '9') {
    pcVar3 = (char *)std::__cxx11::string::operator[](loc_local);
    if (*pcVar3 == '9') {
      local_28 = 1;
      while (pcVar3 = (char *)std::__cxx11::string::operator[](loc_local), *pcVar3 == '9') {
        puVar4 = (undefined1 *)std::__cxx11::string::operator[](loc_local);
        *puVar4 = 0x30;
        if (length_local == (long)local_28) break;
        local_28 = local_28 + 1;
      }
      if ((length_local == (long)local_28) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](loc_local), sVar1 = loc_local,
         *pcVar3 == '0')) {
        local_38._M_current = (char *)std::__cxx11::string::begin();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
        std::__cxx11::string::insert(sVar1,local_30,0x31);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[](loc_local);
        bVar2 = isDigitCharacter(*pcVar3);
        if (bVar2) {
          pcVar3 = (char *)std::__cxx11::string::operator[](loc_local);
          *pcVar3 = *pcVar3 + '\x01';
        }
        else {
          std::__cxx11::string::insert(loc_local,(length_local - (long)local_28) + 1,'\x01');
        }
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[](loc_local);
      *pcVar3 = *pcVar3 + '\x01';
    }
  }
  return;
}

Assistant:

static void shorten_number(std::string& unit_string, size_t loc, size_t length)
{
    auto c = unit_string[loc];
    if (c == '.') {
        c = unit_string[loc + 1];
    }
    unit_string.erase(loc, length);
    if (c == '9') {
        if (unit_string[loc - 1] != '9') {
            ++unit_string[loc - 1];
        } else {
            int kk = 1;
            while (unit_string[loc - kk] == '9') {
                unit_string[loc - kk] = '0';
                if (loc - kk == 0) {
                    break;
                }
                ++kk;
            }
            if (loc - kk == 0 && unit_string[0] == '0') {
                unit_string.insert(unit_string.begin(), '1');
            } else {
                if (isDigitCharacter(unit_string[loc - kk])) {
                    ++unit_string[loc - kk];
                } else {
                    unit_string.insert(loc - kk + 1, 1, '1');
                }
            }
        }
    }
}